

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

IV_API_CALL_STATUS_T get_version(void *codec_obj)

{
  IV_API_CALL_STATUS_T IVar1;
  undefined1 local_238 [8];
  UWORD8 au1_buf [512];
  ivd_ctl_getversioninfo_ip_t s_ctl_dec_ip;
  ivd_ctl_getversioninfo_op_t s_ctl_dec_op;
  
  s_ctl_dec_ip.u4_size = 6;
  au1_buf[0x1f8] = ' ';
  au1_buf[0x1f9] = '\0';
  au1_buf[0x1fa] = '\0';
  au1_buf[0x1fb] = '\0';
  au1_buf[0x1fc] = '\a';
  au1_buf[0x1fd] = '\0';
  au1_buf[0x1fe] = '\0';
  au1_buf[0x1ff] = '\0';
  s_ctl_dec_ip.u4_version_buffer_size = 8;
  s_ctl_dec_ip._8_8_ = local_238;
  s_ctl_dec_ip.pv_version_buffer._0_4_ = 0x200;
  IVar1 = ihevcd_cxa_api_function
                    ((iv_obj_t *)codec_obj,au1_buf + 0x1f8,&s_ctl_dec_ip.u4_version_buffer_size);
  if (IVar1 == IV_SUCCESS) {
    printf("Ittiam Decoder Version number: %s\n",s_ctl_dec_ip._8_8_);
  }
  else {
    printf("Error in Getting Version number e_dec_status = %d u4_error_code = %x\n",(ulong)IVar1,
           (ulong)(uint)s_ctl_dec_ip._28_4_);
  }
  return IVar1;
}

Assistant:

IV_API_CALL_STATUS_T get_version(void *codec_obj)
{
    ivd_ctl_getversioninfo_ip_t s_ctl_dec_ip;
    ivd_ctl_getversioninfo_op_t s_ctl_dec_op;
    UWORD8 au1_buf[512];
    IV_API_CALL_STATUS_T status;
    s_ctl_dec_ip.e_cmd = IVD_CMD_VIDEO_CTL;
    s_ctl_dec_ip.e_sub_cmd = IVD_CMD_CTL_GETVERSION;
    s_ctl_dec_ip.u4_size = sizeof(ivd_ctl_getversioninfo_ip_t);
    s_ctl_dec_op.u4_size = sizeof(ivd_ctl_getversioninfo_op_t);
    s_ctl_dec_ip.pv_version_buffer = au1_buf;
    s_ctl_dec_ip.u4_version_buffer_size = sizeof(au1_buf);

    status = ivd_cxa_api_function((iv_obj_t *)codec_obj,
                                  (void *)&(s_ctl_dec_ip),
                                  (void *)&(s_ctl_dec_op));

    if(status != IV_SUCCESS)
    {
        printf("Error in Getting Version number e_dec_status = %d u4_error_code = %x\n",
               status, s_ctl_dec_op.u4_error_code);
    }
    else
    {
        printf("Ittiam Decoder Version number: %s\n",
               (char *)s_ctl_dec_ip.pv_version_buffer);
    }
    return status;
}